

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *enumNode,Reader *replacement)

{
  ListElementCount LVar1;
  Reader local_50;
  
  capnp::schema::Node::Enum::Reader::getEnumerants(&local_50,enumNode);
  LVar1 = local_50.reader.elementCount;
  capnp::schema::Node::Enum::Reader::getEnumerants(&local_50,replacement);
  if (LVar1 < local_50.reader.elementCount) {
    replacementIsNewer(this);
  }
  else if (local_50.reader.elementCount < LVar1) {
    replacementIsOlder(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Enum::Reader& enumNode,
                          const schema::Node::Enum::Reader& replacement) {
    uint size = enumNode.getEnumerants().size();
    uint replacementSize = replacement.getEnumerants().size();
    if (replacementSize > size) {
      replacementIsNewer();
    } else if (replacementSize < size) {
      replacementIsOlder();
    }
  }